

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo640.c
# Opt level: O0

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss,uint8_t *ct,uint8_t *sk)

{
  uint8_t *input;
  uint16_t uVar1;
  uint16_t uVar2;
  byte bVar3;
  uint8_t auStack_deb68 [9736];
  undefined8 uStack_dc560;
  uint8_t auStack_dc558 [24];
  undefined8 uStack_dc540;
  uint8_t *puStack_dc538;
  uint8_t *puStack_dc530;
  undefined8 uStack_dc528;
  unsigned_long __vla_expr1;
  uint32_t ss_init_len;
  uint8_t x_15;
  uint8_t uu____0_15;
  uint8_t *os_15;
  uint8_t x_14;
  undefined1 *puStack_dc508;
  uint8_t uu____0_14;
  uint8_t *os_14;
  uint8_t x_13;
  undefined1 *puStack_dc4f8;
  uint8_t uu____0_13;
  uint8_t *os_13;
  uint8_t x_12;
  undefined1 *puStack_dc4e8;
  uint8_t uu____0_12;
  uint8_t *os_12;
  uint8_t x_11;
  undefined1 *puStack_dc4d8;
  uint8_t uu____0_11;
  uint8_t *os_11;
  uint8_t x_10;
  undefined1 *puStack_dc4c8;
  uint8_t uu____0_10;
  uint8_t *os_10;
  uint8_t x_9;
  undefined1 *puStack_dc4b8;
  uint8_t uu____0_9;
  uint8_t *os_9;
  uint8_t x_8;
  undefined1 *puStack_dc4a8;
  uint8_t uu____0_8;
  uint8_t *os_8;
  uint8_t x_7;
  undefined1 *puStack_dc498;
  uint8_t uu____0_7;
  uint8_t *os_7;
  uint8_t x_6;
  undefined1 *puStack_dc488;
  uint8_t uu____0_6;
  uint8_t *os_6;
  uint8_t x_5;
  undefined1 *puStack_dc478;
  uint8_t uu____0_5;
  uint8_t *os_5;
  uint8_t x_4;
  undefined1 *puStack_dc468;
  uint8_t uu____0_4;
  uint8_t *os_4;
  uint8_t x_3;
  undefined1 *puStack_dc458;
  uint8_t uu____0_3;
  uint8_t *os_3;
  uint8_t x_2;
  undefined1 *puStack_dc448;
  uint8_t uu____0_2;
  uint8_t *os_2;
  uint8_t x_1;
  undefined1 *puStack_dc438;
  uint8_t uu____0_1;
  uint8_t *os_1;
  uint8_t x;
  undefined1 *puStack_dc428;
  uint8_t uu____0;
  uint8_t *os;
  undefined8 uStack_dc418;
  uint32_t i;
  uint8_t kp_s [16];
  uint16_t mask0;
  uint16_t mask;
  uint16_t b2;
  uint16_t b1;
  uint16_t mu_encode [64];
  uint16_t b_matrix [5120];
  uint16_t a_matrix [409600];
  uint8_t *b;
  uint8_t *seed_a;
  uint8_t *pk;
  uint8_t shake_input_seed_se [17];
  uint8_t auStack_11b38 [8];
  uint8_t r [20608];
  uint16_t epp_matrix [64];
  uint16_t ep_matrix [5120];
  uint16_t sp_matrix [5120];
  uint16_t cp_matrix [64];
  uint16_t bpp_matrix [5120];
  uint8_t *s;
  uint8_t *kp;
  uint8_t *seed_se;
  uint8_t *pkh;
  unsigned_long __vla_expr0;
  uint8_t auStack_5178 [4];
  uint32_t pkh_mu_decode_len;
  uint8_t seed_se_k [32];
  uint16_t m_matrix [64];
  uint16_t s_matrix [5120];
  uint8_t *s_bytes;
  uint8_t mu_decode [16];
  uint8_t *c2;
  uint8_t *c1;
  uint16_t c_matrix [64];
  uint16_t bp_matrix [5120];
  uint8_t *sk_local;
  uint8_t *ct_local;
  uint8_t *ss_local;
  
  uStack_dc540 = 0x27fe4a;
  memset(c_matrix + 0x3c,0,0x2800);
  uStack_dc540 = 0x27fe5d;
  memset(&c1,0,0x80);
  mu_decode._8_8_ = ct + 0x2580;
  uStack_dc540 = 0x27fe9b;
  Hacl_Impl_Frodo_Pack_frodo_unpack(8,0x280,0xf,ct,c_matrix + 0x3c);
  uStack_dc540 = 0x27feba;
  Hacl_Impl_Frodo_Pack_frodo_unpack(8,8,0xf,(uint8_t *)mu_decode._8_8_,(uint16_t *)&c1);
  uStack_dc540 = 0x27fecd;
  memset(&s_bytes,0,0x10);
  uStack_dc540 = 0x27fef1;
  memset(m_matrix + 0x3c,0,0x2800);
  uStack_dc540 = 0x27ff04;
  memset(seed_se_k + 0x18,0,0x80);
  uStack_dc540 = 0x27ff21;
  Hacl_Impl_Matrix_matrix_from_lbytes(0x280,8,sk + 0x25a0,m_matrix + 0x3c);
  uStack_dc540 = 0x27ff47;
  Hacl_Impl_Matrix_matrix_mul_s
            (8,0x280,8,c_matrix + 0x3c,m_matrix + 0x3c,(uint16_t *)(seed_se_k + 0x18));
  uStack_dc540 = 0x27ff61;
  Hacl_Impl_Matrix_matrix_sub(8,8,(uint16_t *)&c1,(uint16_t *)(seed_se_k + 0x18));
  uStack_dc540 = 0x27ff83;
  Hacl_Impl_Frodo_Encode_frodo_key_decode
            (0xf,2,8,(uint16_t *)(seed_se_k + 0x18),(uint8_t *)&s_bytes);
  uStack_dc540 = 0x27ff94;
  Lib_Memzero0_memzero0(m_matrix + 0x3c,0x2800);
  uStack_dc540 = 0x27ffa5;
  Lib_Memzero0_memzero0(seed_se_k + 0x18,0x80);
  uStack_dc540 = 0x27ffb8;
  memset(auStack_5178,0,0x20);
  puStack_dc530 = auStack_dc558;
  uStack_dc560 = 0x280039;
  memset(puStack_dc530,0,0x20);
  input = puStack_dc530;
  *(undefined8 *)puStack_dc530 = *(undefined8 *)(sk + 0x4da0);
  *(undefined8 *)(input + 8) = *(undefined8 *)(sk + 0x4da8);
  *(uint8_t **)(input + 0x10) = s_bytes;
  *(undefined8 *)(input + 0x18) = mu_decode._0_8_;
  uStack_dc560 = 0x280093;
  Hacl_Hash_SHA3_shake128(auStack_5178,0x20,input,0x20);
  uStack_dc560 = 0x2800d1;
  memset(cp_matrix + 0x3c,0,0x2800);
  uStack_dc560 = 0x2800e4;
  memset(sp_matrix + 0x13fc,0,0x80);
  uStack_dc560 = 0x2800f7;
  memset(ep_matrix + 0x13fc,0,0x2800);
  uStack_dc560 = 0x28010a;
  memset(epp_matrix + 0x3c,0,0x2800);
  uStack_dc560 = 0x28011d;
  memset(r + 0x5078,0,0x80);
  uStack_dc560 = 0x280130;
  memset(auStack_11b38,0,0x5080);
  uStack_dc560 = 0x280143;
  memset(&pk,0,0x11);
  pk._0_1_ = 0x96;
  uStack_dc560 = 0x280183;
  Hacl_Hash_SHA3_shake128(auStack_11b38,0x5080,(uint8_t *)&pk,0x11);
  uStack_dc560 = 0x280194;
  Lib_Memzero0_memzero0(&pk,0x11);
  uStack_dc560 = 0x2801b1;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8,0x280,auStack_11b38,ep_matrix + 0x13fc);
  uStack_dc560 = 0x2801d5;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8,0x280,r + 0x27f8,epp_matrix + 0x3c);
  uStack_dc560 = 0x2801f6;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8,8,r + 0x4ff8,(uint16_t *)(r + 0x5078));
  uStack_dc560 = 0x28023c;
  memset(b_matrix + 0x13fc,0,0xc8000);
  uStack_dc560 = 0x280256;
  Hacl_Impl_Frodo_Params_frodo_gen_matrix('\0',0x280,sk + 0x10,b_matrix + 0x13fc);
  uStack_dc560 = 0x28027c;
  Hacl_Impl_Matrix_matrix_mul(8,0x280,0x280,ep_matrix + 0x13fc,b_matrix + 0x13fc,cp_matrix + 0x3c);
  uStack_dc560 = 0x280299;
  Hacl_Impl_Matrix_matrix_add(8,0x280,cp_matrix + 0x3c,epp_matrix + 0x3c);
  uStack_dc560 = 0x2802ac;
  memset(mu_encode + 0x3c,0,0x2800);
  uStack_dc560 = 0x2802ce;
  Hacl_Impl_Frodo_Pack_frodo_unpack(0x280,8,0xf,sk + 0x20,mu_encode + 0x3c);
  uStack_dc560 = 0x2802f4;
  Hacl_Impl_Matrix_matrix_mul(8,0x280,8,ep_matrix + 0x13fc,mu_encode + 0x3c,sp_matrix + 0x13fc);
  uStack_dc560 = 0x28030e;
  Hacl_Impl_Matrix_matrix_add(8,8,sp_matrix + 0x13fc,(uint16_t *)(r + 0x5078));
  uStack_dc560 = 0x280321;
  memset(&mask0,0,0x80);
  uStack_dc560 = 0x280343;
  Hacl_Impl_Frodo_Encode_frodo_key_encode(0xf,2,8,(uint8_t *)&s_bytes,&mask0);
  uStack_dc560 = 0x28035d;
  Hacl_Impl_Matrix_matrix_add(8,8,sp_matrix + 0x13fc,&mask0);
  uStack_dc560 = 0x28036e;
  Lib_Memzero0_memzero0(&mask0,0x80);
  uStack_dc560 = 0x280389;
  Hacl_Impl_Matrix_mod_pow2(8,0x280,0xf,cp_matrix + 0x3c);
  uStack_dc560 = 0x2803a1;
  Hacl_Impl_Matrix_mod_pow2(8,8,0xf,sp_matrix + 0x13fc);
  uStack_dc560 = 0x2803b2;
  Lib_Memzero0_memzero0(ep_matrix + 0x13fc,0x2800);
  uStack_dc560 = 0x2803c3;
  Lib_Memzero0_memzero0(epp_matrix + 0x3c,0x2800);
  uStack_dc560 = 0x2803d4;
  Lib_Memzero0_memzero0(r + 0x5078,0x80);
  uStack_dc560 = 0x2803f1;
  uVar1 = Hacl_Impl_Matrix_matrix_eq(8,0x280,c_matrix + 0x3c,cp_matrix + 0x3c);
  uStack_dc560 = 0x280412;
  uVar2 = Hacl_Impl_Matrix_matrix_eq(8,8,(uint16_t *)&c1,sp_matrix + 0x13fc);
  bVar3 = (byte)uVar1 & (byte)uVar2;
  uStack_dc560 = 0x280451;
  memset(&stack0xfffffffffff23be8,0,0x10);
  puStack_dc428 = (undefined1 *)&stack0xfffffffffff23be8;
  os_1._7_1_ = *sk;
  os_1._6_1_ = os_1._7_1_ ^ bVar3 & (seed_se_k[8] ^ os_1._7_1_);
  puStack_dc438 = (undefined1 *)&stack0xfffffffffff23be8;
  os_2._7_1_ = sk[1];
  os_2._6_1_ = os_2._7_1_ ^ bVar3 & (seed_se_k[9] ^ os_2._7_1_);
  puStack_dc448 = (undefined1 *)&stack0xfffffffffff23be8;
  os_3._7_1_ = sk[2];
  os_3._6_1_ = os_3._7_1_ ^ bVar3 & (seed_se_k[10] ^ os_3._7_1_);
  puStack_dc458 = (undefined1 *)&stack0xfffffffffff23be8;
  os_4._7_1_ = sk[3];
  os_4._6_1_ = os_4._7_1_ ^ bVar3 & (seed_se_k[0xb] ^ os_4._7_1_);
  puStack_dc468 = (undefined1 *)&stack0xfffffffffff23be8;
  os_5._7_1_ = sk[4];
  os_5._6_1_ = os_5._7_1_ ^ bVar3 & (seed_se_k[0xc] ^ os_5._7_1_);
  puStack_dc478 = (undefined1 *)&stack0xfffffffffff23be8;
  os_6._7_1_ = sk[5];
  os_6._6_1_ = os_6._7_1_ ^ bVar3 & (seed_se_k[0xd] ^ os_6._7_1_);
  puStack_dc488 = (undefined1 *)&stack0xfffffffffff23be8;
  os_7._7_1_ = sk[6];
  os_7._6_1_ = os_7._7_1_ ^ bVar3 & (seed_se_k[0xe] ^ os_7._7_1_);
  puStack_dc498 = (undefined1 *)&stack0xfffffffffff23be8;
  os_8._7_1_ = sk[7];
  os_8._6_1_ = os_8._7_1_ ^ bVar3 & (seed_se_k[0xf] ^ os_8._7_1_);
  puStack_dc4a8 = (undefined1 *)&stack0xfffffffffff23be8;
  os_9._7_1_ = sk[8];
  os_9._6_1_ = os_9._7_1_ ^ bVar3 & (seed_se_k[0x10] ^ os_9._7_1_);
  puStack_dc4b8 = (undefined1 *)&stack0xfffffffffff23be8;
  os_10._7_1_ = sk[9];
  os_10._6_1_ = os_10._7_1_ ^ bVar3 & (seed_se_k[0x11] ^ os_10._7_1_);
  puStack_dc4c8 = (undefined1 *)&stack0xfffffffffff23be8;
  os_11._7_1_ = sk[10];
  os_11._6_1_ = os_11._7_1_ ^ bVar3 & (seed_se_k[0x12] ^ os_11._7_1_);
  puStack_dc4d8 = (undefined1 *)&stack0xfffffffffff23be8;
  os_12._7_1_ = sk[0xb];
  os_12._6_1_ = os_12._7_1_ ^ bVar3 & (seed_se_k[0x13] ^ os_12._7_1_);
  puStack_dc4e8 = (undefined1 *)&stack0xfffffffffff23be8;
  os_13._7_1_ = sk[0xc];
  os_13._6_1_ = os_13._7_1_ ^ bVar3 & (seed_se_k[0x14] ^ os_13._7_1_);
  puStack_dc4f8 = (undefined1 *)&stack0xfffffffffff23be8;
  os_14._7_1_ = sk[0xd];
  os_14._6_1_ = os_14._7_1_ ^ bVar3 & (seed_se_k[0x15] ^ os_14._7_1_);
  puStack_dc508 = (undefined1 *)&stack0xfffffffffff23be8;
  os_15._7_1_ = sk[0xe];
  os_15._6_1_ = os_15._7_1_ ^ bVar3 & (seed_se_k[0x16] ^ os_15._7_1_);
  _ss_init_len = (undefined1 *)&stack0xfffffffffff23be8;
  __vla_expr1._7_1_ = sk[0xf];
  __vla_expr1._6_1_ = __vla_expr1._7_1_ ^ bVar3 & (seed_se_k[0x17] ^ __vla_expr1._7_1_);
  os._4_4_ = 0x10;
  __vla_expr1._0_4_ = 0x2608;
  uStack_dc528 = 0x2608;
  puStack_dc538 = auStack_deb68;
  memset(puStack_dc538,0,0x2608);
  memcpy(puStack_dc538,ct,0x25f8);
  *(undefined8 *)(puStack_dc538 + 0x25f8) = uStack_dc418;
  *(undefined8 *)(puStack_dc538 + 0x2600) = kp_s._0_8_;
  Hacl_Hash_SHA3_shake128(ss,0x10,puStack_dc538,(uint32_t)__vla_expr1);
  Lib_Memzero0_memzero0(puStack_dc538,(ulong)(uint32_t)__vla_expr1);
  Lib_Memzero0_memzero0(&stack0xfffffffffff23be8,0x10);
  Lib_Memzero0_memzero0(auStack_5178,0x20);
  Lib_Memzero0_memzero0(&s_bytes,0x10);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo640_crypto_kem_dec(uint8_t *ss, uint8_t *ct, uint8_t *sk)
{
  uint16_t bp_matrix[5120U] = { 0U };
  uint16_t c_matrix[64U] = { 0U };
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 9600U;
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 640U, 15U, c1, bp_matrix);
  Hacl_Impl_Frodo_Pack_frodo_unpack(8U, 8U, 15U, c2, c_matrix);
  uint8_t mu_decode[16U] = { 0U };
  uint8_t *s_bytes = sk + 9632U;
  uint16_t s_matrix[5120U] = { 0U };
  uint16_t m_matrix[64U] = { 0U };
  Hacl_Impl_Matrix_matrix_from_lbytes(640U, 8U, s_bytes, s_matrix);
  Hacl_Impl_Matrix_matrix_mul_s(8U, 640U, 8U, bp_matrix, s_matrix, m_matrix);
  Hacl_Impl_Matrix_matrix_sub(8U, 8U, c_matrix, m_matrix);
  Hacl_Impl_Frodo_Encode_frodo_key_decode(15U, 2U, 8U, m_matrix, mu_decode);
  Lib_Memzero0_memzero(s_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(m_matrix, 64U, uint16_t, void *);
  uint8_t seed_se_k[32U] = { 0U };
  uint32_t pkh_mu_decode_len = 32U;
  KRML_CHECK_SIZE(sizeof (uint8_t), pkh_mu_decode_len);
  uint8_t pkh_mu_decode[pkh_mu_decode_len];
  memset(pkh_mu_decode, 0U, pkh_mu_decode_len * sizeof (uint8_t));
  uint8_t *pkh = sk + 19872U;
  memcpy(pkh_mu_decode, pkh, 16U * sizeof (uint8_t));
  memcpy(pkh_mu_decode + 16U, mu_decode, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(seed_se_k, 32U, pkh_mu_decode, pkh_mu_decode_len);
  uint8_t *seed_se = seed_se_k;
  uint8_t *kp = seed_se_k + 16U;
  uint8_t *s = sk;
  uint16_t bpp_matrix[5120U] = { 0U };
  uint16_t cp_matrix[64U] = { 0U };
  uint16_t sp_matrix[5120U] = { 0U };
  uint16_t ep_matrix[5120U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[20608U] = { 0U };
  uint8_t shake_input_seed_se[17U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(r, 20608U, shake_input_seed_se, 17U);
  Lib_Memzero0_memzero(shake_input_seed_se, 17U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 640U, r + 10240U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix640(8U, 8U, r + 20480U, epp_matrix);
  uint8_t *pk = sk + 16U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  KRML_CHECK_SIZE(sizeof (uint16_t), 409600U);
  uint16_t a_matrix[409600U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 640U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 640U, sp_matrix, a_matrix, bpp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 640U, bpp_matrix, ep_matrix);
  uint16_t b_matrix[5120U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(640U, 8U, 15U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 640U, 8U, sp_matrix, b_matrix, cp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(15U, 2U, 8U, mu_decode, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, cp_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Matrix_mod_pow2(8U, 640U, 15U, bpp_matrix);
  Hacl_Impl_Matrix_mod_pow2(8U, 8U, 15U, cp_matrix);
  Lib_Memzero0_memzero(sp_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 5120U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint16_t b1 = Hacl_Impl_Matrix_matrix_eq(8U, 640U, bp_matrix, bpp_matrix);
  uint16_t b2 = Hacl_Impl_Matrix_matrix_eq(8U, 8U, c_matrix, cp_matrix);
  uint16_t mask = (uint32_t)b1 & (uint32_t)b2;
  uint16_t mask0 = mask;
  uint8_t kp_s[16U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    uint8_t *os = kp_s;
    uint8_t uu____0 = s[i];
    uint8_t
    x = (uint32_t)uu____0 ^ ((uint32_t)(uint8_t)mask0 & ((uint32_t)kp[i] ^ (uint32_t)uu____0));
    os[i] = x;);
  uint32_t ss_init_len = 9736U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t ss_init[ss_init_len];
  memset(ss_init, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(ss_init, ct, 9720U * sizeof (uint8_t));
  memcpy(ss_init + 9720U, kp_s, 16U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake128(ss, 16U, ss_init, ss_init_len);
  Lib_Memzero0_memzero(ss_init, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(kp_s, 16U, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 32U, uint8_t, void *);
  Lib_Memzero0_memzero(mu_decode, 16U, uint8_t, void *);
  return 0U;
}